

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

int __thiscall pbrt::NanoVDBBuffer::init(NanoVDBBuffer *this,EVP_PKEY_CTX *ctx)

{
  memory_resource *pmVar1;
  int iVar2;
  EVP_PKEY_CTX *extraout_RAX;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RAX_00;
  NanoVDBBuffer *local_18;
  EVP_PKEY_CTX *pEVar3;
  
  pEVar3 = (EVP_PKEY_CTX *)this->bytesAllocated;
  if (pEVar3 != ctx) {
    if (pEVar3 != (EVP_PKEY_CTX *)0x0) {
      clear(this);
      pEVar3 = extraout_RAX;
    }
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      this->bytesAllocated = (size_t)ctx;
      pmVar1 = (this->alloc).memoryResource;
      iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,ctx,0x80);
      pEVar3 = (EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar2);
      this->ptr = (uint8_t *)pEVar3;
      if (LOGGING_LogLevel < 1) {
        local_18 = this;
        Log<pbrt::NanoVDBBuffer*,unsigned_char*&,unsigned_long&>
                  (Verbose,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media.h"
                   ,0x212,"this %p alloc ptr %p bytes %d",&local_18,&this->ptr,&this->bytesAllocated
                  );
        pEVar3 = extraout_RAX_00;
      }
    }
  }
  return (int)pEVar3;
}

Assistant:

void init(uint64_t size) {
        if (size == bytesAllocated)
            return;
        if (bytesAllocated > 0)
            clear();
        if (size == 0)
            return;
        bytesAllocated = size;
        ptr = (uint8_t *)alloc.allocate_bytes(bytesAllocated, 128);
        LOG_VERBOSE("this %p alloc ptr %p bytes %d", this, ptr, bytesAllocated);
    }